

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCacheHandler.cpp
# Opt level: O3

void __thiscall irr::video::COpenGLCacheHandler::setAlphaTest(COpenGLCacheHandler *this,bool enable)

{
  if (this->AlphaTest != enable) {
    if (enable) {
      glEnable();
    }
    else {
      glDisable(0xbc0);
    }
    this->AlphaTest = enable;
  }
  return;
}

Assistant:

void COpenGLCacheHandler::setAlphaTest(bool enable)
{
	if (AlphaTest != enable) {
		if (enable)
			glEnable(GL_ALPHA_TEST);
		else
			glDisable(GL_ALPHA_TEST);
		AlphaTest = enable;
	}
}